

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

void Assimp::FindMeshCenter(aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  aiVector3D *v1;
  aiVector3t<float> aVar1;
  undefined8 local_80;
  float local_78;
  aiVector3t<float> local_70;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40 [2];
  aiVector3t<float> *local_28;
  aiVector3D *max_local;
  aiVector3D *min_local;
  aiVector3D *out_local;
  aiMesh *mesh_local;
  
  local_28 = max;
  max_local = min;
  min_local = out;
  out_local = (aiVector3D *)mesh;
  ArrayBounds<aiVector3t<float>>(mesh->mVertices,mesh->mNumVertices,min,max);
  v1 = max_local;
  aVar1 = ::operator-(local_28,max_local);
  local_60.z = aVar1.z;
  local_50.z = local_60.z;
  local_60._0_8_ = aVar1._0_8_;
  local_50.x = local_60.x;
  local_50.y = local_60.y;
  aVar1 = ::operator*(&local_50,0.5);
  local_70.z = aVar1.z;
  local_40[0].z = local_70.z;
  local_70._0_8_ = aVar1._0_8_;
  local_40[0].x = local_70.x;
  local_40[0].y = local_70.y;
  aVar1 = ::operator+(v1,local_40);
  local_80 = aVar1._0_8_;
  local_78 = aVar1.z;
  min_local->x = (float)(undefined4)local_80;
  min_local->y = (float)local_80._4_4_;
  min_local->z = local_78;
  return;
}

Assistant:

void FindMeshCenter (aiMesh* mesh, aiVector3D& out, aiVector3D& min, aiVector3D& max)
{
    ArrayBounds(mesh->mVertices,mesh->mNumVertices, min,max);
    out = min + (max-min)*(ai_real)0.5;
}